

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::ZeroObjColSingletonPS::execute
          (ZeroObjColSingletonPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  double *pdVar7;
  undefined8 *puVar8;
  double dVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  ulong uStack_40;
  
  iVar1 = this->m_j;
  iVar2 = this->m_old_j;
  if (iVar1 != iVar2) {
    pdVar3 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[iVar1];
    pdVar3 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[iVar1];
    cStatus->data[iVar2] = cStatus->data[iVar1];
  }
  dVar9 = SVectorBase<double>::operator[](&(this->m_row).super_SVectorBase<double>,iVar1);
  pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar10 = pdVar3[this->m_i];
  if (ABS(dVar10) <= 1e-06) {
    pdVar3[this->m_i] = 0.0;
  }
  else {
    ::soplex::infinity::__tls_init();
    pdVar7 = (double *)__tls_get_addr(&PTR_003b6b60);
    if (*pdVar7 <= dVar10) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Simplifier: infinite activities - aborting unsimplification",
                 "");
      *puVar8 = &PTR__SPxException_003af870;
      puVar8[1] = puVar8 + 3;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar8 + 1),local_b8,local_b8 + local_b0)
      ;
      __cxa_throw(puVar8,&SPxException::typeinfo,SPxException::~SPxException);
    }
  }
  dVar10 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[this->m_i];
  auVar11._0_8_ = ABS(this->m_lhs);
  auVar11._8_8_ = ABS(this->m_rhs);
  auVar14._0_8_ = ABS(dVar10);
  auVar14._8_8_ = ABS(dVar10);
  auVar11 = maxpd(auVar11,auVar14);
  dVar17 = auVar11._8_8_;
  auVar15._8_8_ = -(ulong)(dVar17 < 1.0);
  auVar15._0_8_ = -(ulong)(auVar11._0_8_ < 1.0);
  uVar6 = movmskpd(this->m_i,auVar15);
  local_98 = 1.0;
  dStack_90 = 0.0;
  if ((uVar6 & 1) == 0) {
    local_98 = auVar11._0_8_;
    dStack_90 = dVar17;
  }
  dVar13 = 1.0;
  if ((uVar6 & 2) == 0) {
    dVar13 = dVar17;
  }
  auVar18._8_8_ = dVar10;
  auVar18._0_8_ = this->m_lhs;
  auVar12._8_8_ = local_98;
  auVar12._0_8_ = local_98;
  auVar11 = divpd(auVar18,auVar12);
  dVar19 = auVar11._8_8_;
  dVar17 = auVar11._0_8_ - dVar19;
  auVar16._8_8_ = dVar10;
  auVar16._0_8_ = this->m_rhs;
  auVar4._8_8_ = dVar13;
  auVar4._0_8_ = dVar13;
  auVar11 = divpd(auVar16,auVar4);
  dStack_80 = auVar11._8_8_;
  local_88 = auVar11._0_8_ - dStack_80;
  (*(this->super_PostStep)._vptr_PostStep[7])(this);
  (*(this->super_PostStep)._vptr_PostStep[7])(this);
  dStack_80 = (double)(~(ulong)ABS(dStack_80) & (ulong)dStack_80);
  dVar17 = (double)(~-(ulong)(ABS(dVar17) <= extraout_XMM0_Qa) & (ulong)dVar17) * local_98;
  local_88 = (double)(~-(ulong)(ABS(local_88) <= extraout_XMM0_Qa_00) & (ulong)local_88) * dVar13;
  dVar10 = local_88;
  uStack_60 = (ulong)dStack_80;
  if (0.0 < dVar9) {
    dVar10 = dVar17;
    uStack_60 = ~(ulong)ABS(dVar19) & (ulong)dVar19;
  }
  (*(this->super_PostStep)._vptr_PostStep[6])(this);
  local_98 = extraout_XMM0_Qa_01;
  (*(this->super_PostStep)._vptr_PostStep[6])(this);
  switch(rStatus->data[this->m_i]) {
  case ON_UPPER:
    dVar10 = this->m_lower;
    ::soplex::infinity::__tls_init();
    pdVar7 = (double *)__tls_get_addr(&PTR_003b6b60);
    dVar17 = *pdVar7;
    if ((-dVar17 < dVar10) ||
       (dVar10 = this->m_upper, ::soplex::infinity::__tls_init(), dVar10 < dVar17)) {
      dVar10 = this->m_lower;
      dVar17 = this->m_upper;
      if ((dVar10 != dVar17) || (NAN(dVar10) || NAN(dVar17))) {
        if (0.0 < dVar9) {
          iVar1 = this->m_j;
          (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = dVar10;
          cStatus->data[iVar1] = ON_LOWER;
        }
        else {
          if (0.0 <= dVar9) {
            puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_b8 = local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"XMAISM02 This should never happen.","");
            *puVar8 = &PTR__SPxException_003af870;
            puVar8[1] = puVar8 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar8 + 1),local_b8,local_b8 + local_b0);
            *puVar8 = &PTR__SPxException_003b0638;
            __cxa_throw(puVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          iVar1 = this->m_j;
          (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = dVar17;
          cStatus->data[iVar1] = ON_UPPER;
        }
        goto LAB_00220065;
      }
LAB_0021fda7:
      iVar1 = this->m_j;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = dVar10;
      cStatus->data[iVar1] = FIXED;
      goto LAB_00220065;
    }
    break;
  case ON_LOWER:
    dVar10 = this->m_lower;
    ::soplex::infinity::__tls_init();
    pdVar7 = (double *)__tls_get_addr(&PTR_003b6b60);
    dVar17 = *pdVar7;
    if ((-dVar17 < dVar10) ||
       (dVar10 = this->m_upper, ::soplex::infinity::__tls_init(), dVar10 < dVar17)) {
      dVar10 = this->m_lower;
      dVar17 = this->m_upper;
      if ((dVar10 != dVar17) || (NAN(dVar10) || NAN(dVar17))) {
        if (dVar9 <= 0.0) {
          if (0.0 <= dVar9) {
            puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_b8 = local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"XMAISM01 This should never happen.","");
            *puVar8 = &PTR__SPxException_003af870;
            puVar8[1] = puVar8 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar8 + 1),local_b8,local_b8 + local_b0);
            *puVar8 = &PTR__SPxException_003b0638;
            __cxa_throw(puVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          iVar1 = this->m_j;
          (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = dVar10;
          cStatus->data[iVar1] = ON_LOWER;
        }
        else {
          iVar1 = this->m_j;
          (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = dVar17;
          cStatus->data[iVar1] = ON_UPPER;
        }
        goto LAB_00220065;
      }
      goto LAB_0021fda7;
    }
    break;
  case FIXED:
    dVar10 = this->m_lower;
    ::soplex::infinity::__tls_init();
    pdVar7 = (double *)__tls_get_addr(&PTR_003b6b60);
    dVar17 = *pdVar7;
    if ((-dVar17 < dVar10) ||
       (dVar10 = this->m_upper, ::soplex::infinity::__tls_init(), dVar10 < dVar17)) {
      iVar1 = this->m_j;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = (this->m_lower + this->m_upper) * 0.5;
      cStatus->data[iVar1] = FIXED;
    }
    else {
      iVar1 = this->m_j;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = 0.0;
      cStatus->data[iVar1] = ZERO;
    }
    goto LAB_00220065;
  default:
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"XMAISM04 This should never happen.","");
    *puVar8 = &PTR__SPxException_003af870;
    puVar8[1] = puVar8 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar8 + 1),local_b8,local_b8 + local_b0);
    *puVar8 = &PTR__SPxException_003b0638;
    __cxa_throw(puVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case BASIC:
    dVar10 = dVar10 / dVar9;
    local_48 = ABS(dVar10);
    uStack_40 = uStack_60 & 0x7fffffffffffffff;
    local_68 = (double)(~-(ulong)(local_48 <= local_98) & (ulong)dVar10);
    uStack_60 = ~uStack_40 & uStack_60;
    local_58 = this->m_lower;
    uStack_50 = 0;
    local_70 = extraout_XMM0_Qa_02;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    dVar13 = (double)(~-(ulong)(local_48 <= local_98) & (ulong)ABS(dVar10));
    dVar10 = ABS(local_58);
    if (ABS(local_58) <= dVar13) {
      dVar10 = dVar13;
    }
    if (dVar10 <= 1.0) {
      dVar10 = 1.0;
    }
    if (-extraout_XMM0_Qa_03 < (local_58 - local_68) / dVar10) {
      dVar10 = this->m_lower;
      ::soplex::infinity::__tls_init();
      pdVar7 = (double *)__tls_get_addr(&PTR_003b6b60);
      if (-*pdVar7 < dVar10) {
        iVar1 = this->m_j;
        (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[iVar1] = this->m_lower;
        cStatus->data[iVar1] = (this->m_upper == this->m_lower) + ON_LOWER;
        goto LAB_00220065;
      }
    }
    local_98 = (double)(~-(ulong)(dVar9 <= 0.0) & (ulong)local_88 |
                       (ulong)dVar17 & -(ulong)(dVar9 <= 0.0)) / dVar9;
    dStack_90 = dStack_80;
    dVar10 = ABS(local_98);
    dVar17 = (double)(~-(ulong)(dVar10 <= local_70) & (ulong)local_98);
    local_88 = this->m_upper;
    dStack_80 = 0.0;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    dVar13 = (double)(~-(ulong)(dVar10 <= local_70) & (ulong)ABS(local_98));
    dVar10 = ABS(local_88);
    if (ABS(local_88) <= dVar13) {
      dVar10 = dVar13;
    }
    if (dVar10 <= 1.0) {
      dVar10 = 1.0;
    }
    if ((local_88 - dVar17) / dVar10 <= extraout_XMM0_Qa_04) {
      dVar10 = this->m_upper;
      ::soplex::infinity::__tls_init();
      pdVar7 = (double *)__tls_get_addr(&PTR_003b6b60);
      if (dVar10 < *pdVar7) {
        iVar1 = this->m_j;
        (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[iVar1] = this->m_upper;
        cStatus->data[iVar1] = (-(uint)(this->m_upper == this->m_lower) & 1) * 2;
        goto LAB_00220065;
      }
    }
    ::soplex::infinity::__tls_init();
    pdVar7 = (double *)__tls_get_addr(&PTR_003b6b60);
    dVar10 = *pdVar7;
    if (local_68 <= -dVar10) {
      ::soplex::infinity::__tls_init();
      if (dVar10 <= dVar17) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"XMAISM03 This should never happen.","");
        *puVar8 = &PTR__SPxException_003af870;
        puVar8[1] = puVar8 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar8 + 1),local_b8,local_b8 + local_b0);
        *puVar8 = &PTR__SPxException_003b0638;
        __cxa_throw(puVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      bVar5 = dVar9 <= 0.0;
    }
    else {
      bVar5 = 0.0 < dVar9;
      dVar17 = local_68;
    }
    iVar1 = this->m_j;
    (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar1] = dVar17;
    cStatus->data[iVar1] = BASIC;
    rStatus->data[this->m_i] = (uint)bVar5;
    goto LAB_00220065;
  }
  iVar1 = this->m_j;
  (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar1] = 0.0;
  cStatus->data[iVar1] = ZERO;
LAB_00220065:
  iVar1 = this->m_j;
  iVar2 = this->m_i;
  pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3[iVar2] =
       (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar1] * dVar9 + pdVar3[iVar2];
  (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar1] =
       -dVar9 * (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2];
  return;
}

Assistant:

void SPxMainSM<R>::ZeroObjColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal & basis:
   R aij = m_row[m_j];

   if(isZero(s[m_i], R(1e-6)))
      s[m_i] = 0.0;
   else if(s[m_i] >= R(infinity))
      // this is a fix for a highly ill conditioned instance that is "solved" in presolving (ilaser0 from MINLP, mittelmann)
      throw SPxException("Simplifier: infinite activities - aborting unsimplification");

   R scale1 = maxAbs(m_lhs, s[m_i]);
   R scale2 = maxAbs(m_rhs, s[m_i]);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (m_lhs / scale1) - (s[m_i] / scale1);
   R z2 = (m_rhs / scale2) - (s[m_i] / scale2);

   if(isZero(z1, this->epsilon()))
      z1 = 0.0;

   if(isZero(z2, this->epsilon()))
      z2 = 0.0;

   R lo = (aij > 0) ? z1 * scale1 / aij : z2 * scale2 / aij;
   R up = (aij > 0) ? z2 * scale2 / aij : z1 * scale1 / aij;

   if(isZero(lo, this->feastol()))
      lo = 0.0;

   if(isZero(up, this->feastol()))
      up = 0.0;

   assert(LErel(lo, up, this->epsilon()));
   SOPLEX_ASSERT_WARN("WMAISM01", isNotZero(aij, R(1.0 / R(infinity))));

   if(rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else
         throw SPxInternalCodeException("XMAISM01 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else
         throw SPxInternalCodeException("XMAISM02 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::FIXED)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else
      {
         assert(EQrel(m_lower, m_upper, this->feastol()));

         x[m_j]        = (m_lower + m_upper) / 2.0;
         cStatus[m_j]  = SPxSolverBase<R>::FIXED;
      }
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::BASIC)
   {
      if(GErel(m_lower, lo, this->feastol()) && m_lower > R(-infinity))
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else if(LErel(m_upper, up, this->feastol()) && m_upper < R(infinity))
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else if(lo > R(-infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = lo;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER);
      }
      else if(up < R(infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = up;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ON_LOWER);
      }
      else
         throw SPxInternalCodeException("XMAISM03 This should never happen.");
   }
   else
      throw SPxInternalCodeException("XMAISM04 This should never happen.");

   s[m_i] += aij * x[m_j];

   // dual:
   r[m_j] = -1.0 * aij * y[m_i];

   assert(!isOptimal || (cStatus[m_j] != SPxSolverBase<R>::BASIC || isZero(r[m_j], this->feastol())));

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM21 Dimension doesn't match after this step.");
   }

#endif
}